

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Binary_Operator_AST_Node::do_oper
          (Binary_Operator_AST_Node *this,Dispatch_State *t_ss,Opers t_oper,string *t_oper_string,
          Boxed_Value *t_lhs,Boxed_Value *t_rhs)

{
  initializer_list<chaiscript::Boxed_Value> t_params;
  bool bVar1;
  Type_Info *pTVar2;
  Dispatch_Engine *this_00;
  string *t_name;
  int in_ECX;
  Dispatch_State *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  Boxed_Value BVar4;
  dispatch_error *e;
  Function_Push_Pop fpp;
  arithmetic_error *anon_var_0;
  Boxed_Value *in_stack_fffffffffffffdd8;
  Boxed_Value *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  Opers in_stack_fffffffffffffdec;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffdf0;
  allocator_type *in_stack_fffffffffffffe08;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe10;
  initializer_list<chaiscript::Boxed_Value> in_stack_fffffffffffffe18;
  Type_Conversions_State *in_stack_fffffffffffffe30;
  undefined8 **ppuVar5;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe38;
  undefined8 **ppuVar6;
  atomic_uint_fast32_t *in_stack_fffffffffffffe40;
  undefined1 **local_178;
  undefined1 *local_f0 [4];
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined1 *local_a8 [4];
  undefined8 *local_88;
  undefined8 local_80;
  Dispatch_State *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_18 = in_RDX;
  if (in_ECX != 0x25) {
    pTVar2 = Boxed_Value::get_type_info((Boxed_Value *)0x1d500c);
    bVar1 = Type_Info::is_arithmetic(pTVar2);
    if (bVar1) {
      pTVar2 = Boxed_Value::get_type_info((Boxed_Value *)0x1d502a);
      bVar1 = Type_Info::is_arithmetic(pTVar2);
      if (bVar1) {
        BVar4 = Boxed_Number::do_oper
                          (in_stack_fffffffffffffdec,in_stack_fffffffffffffde0,
                           in_stack_fffffffffffffdd8);
        _Var3._M_pi = BVar4.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        goto LAB_001d565e;
      }
    }
  }
  eval::detail::Function_Push_Pop::Function_Push_Pop
            ((Function_Push_Pop *)in_stack_fffffffffffffdf0,
             (Dispatch_State *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  Boxed_Value::Boxed_Value(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  Boxed_Value::Boxed_Value(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_80 = 2;
  t_params._M_array._4_4_ = in_stack_fffffffffffffdec;
  t_params._M_array._0_4_ = in_stack_fffffffffffffde8;
  t_params._M_len = (size_type)in_stack_fffffffffffffdf0;
  local_88 = local_a8;
  eval::detail::Function_Push_Pop::save_params
            ((Function_Push_Pop *)in_stack_fffffffffffffde0,t_params);
  local_178 = (undefined1 **)&local_88;
  do {
    local_178 = local_178 + -2;
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x1d5260);
  } while (local_178 != local_a8);
  this_00 = chaiscript::detail::Dispatch_State::operator->((Dispatch_State *)0x1d528a);
  Boxed_Value::Boxed_Value(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  Boxed_Value::Boxed_Value(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_c8 = 2;
  local_d0 = local_f0;
  std::allocator<chaiscript::Boxed_Value>::allocator((allocator<chaiscript::Boxed_Value> *)0x1d531b)
  ;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe08);
  t_name = (string *)chaiscript::detail::Dispatch_State::conversions(local_18);
  chaiscript::detail::Dispatch_Engine::call_function
            (this_00,t_name,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe30);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            (in_stack_fffffffffffffdf0);
  std::allocator<chaiscript::Boxed_Value>::~allocator
            ((allocator<chaiscript::Boxed_Value> *)0x1d53a1);
  ppuVar6 = (undefined8 **)local_f0;
  ppuVar5 = &local_d0;
  do {
    ppuVar5 = ppuVar5 + -2;
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x1d53ca);
  } while (ppuVar5 != ppuVar6);
  eval::detail::Function_Push_Pop::~Function_Push_Pop
            ((Function_Push_Pop *)in_stack_fffffffffffffdf0);
  _Var3._M_pi = extraout_RDX;
LAB_001d565e:
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_oper(const chaiscript::detail::Dispatch_State &t_ss, 
            Operators::Opers t_oper, const std::string &t_oper_string, const Boxed_Value &t_lhs, const Boxed_Value &t_rhs) const
        {
          try {
            if (t_oper != Operators::invalid && t_lhs.get_type_info().is_arithmetic() && t_rhs.get_type_info().is_arithmetic())
            {
              // If it's an arithmetic operation we want to short circuit dispatch
              try{
                return Boxed_Number::do_oper(t_oper, t_lhs, t_rhs);
              } catch (const chaiscript::exception::arithmetic_error &) {
                throw;
              } catch (...) {
                throw exception::eval_error("Error with numeric operator calling: " + t_oper_string);
              }
            } else {
              chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);
              fpp.save_params({t_lhs, t_rhs});
              return t_ss->call_function(t_oper_string, m_loc, {t_lhs, t_rhs}, t_ss.conversions());
            }
          }
          catch(const exception::dispatch_error &e){
            throw exception::eval_error("Can not find appropriate '" + t_oper_string + "' operator.", e.parameters, e.functions, false, *t_ss);
          }
        }